

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_system.cpp
# Opt level: O2

string * __thiscall
duckdb::FileSystem::ConvertSeparators(string *__return_storage_ptr__,FileSystem *this,string *path)

{
  string separator_str;
  allocator local_79;
  string local_78;
  string local_58;
  string local_38;
  
  (*this->_vptr_FileSystem[0x18])(&local_38);
  if (*local_38._M_dataplus._M_p == '/') {
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)path);
  }
  else {
    ::std::__cxx11::string::string((string *)&local_58,(string *)path);
    ::std::__cxx11::string::string((string *)&local_78,"/",&local_79);
    StringUtil::Replace(__return_storage_ptr__,&local_58,&local_78,&local_38);
    ::std::__cxx11::string::~string((string *)&local_78);
    ::std::__cxx11::string::~string((string *)&local_58);
  }
  ::std::__cxx11::string::~string((string *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

string FileSystem::ConvertSeparators(const string &path) {
	auto separator_str = PathSeparator(path);
	char separator = separator_str[0];
	if (separator == '/') {
		// on unix-based systems we only accept / as a separator
		return path;
	}
	// on windows-based systems we accept both
	return StringUtil::Replace(path, "/", separator_str);
}